

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

AddrOpnd * __thiscall IR::AddrOpnd::CopyInternal(AddrOpnd *this,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  AddrOpnd *this_00;
  AddrOpnd *newOpnd;
  Func *func_local;
  AddrOpnd *this_local;
  
  if ((this->super_Opnd).m_kind != OpndKindAddr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x8d1,"(m_kind == OpndKindAddr)","m_kind == OpndKindAddr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this_00 = New((Var)0x0,this->addrOpndKind,func,(bool)(this->field_0x28 & 1),(Var)0x0);
  this_00->m_address = this->m_address;
  (this_00->super_Opnd).m_valueType.field_0 = (this->super_Opnd).m_valueType.field_0;
  this_00->field_0x28 = this_00->field_0x28 & 0xfd | ((byte)this->field_0x28 >> 1 & 1) << 1;
  this_00->m_metadata = this->m_metadata;
  Opnd::SetType(&this_00->super_Opnd,(this->super_Opnd).m_type);
  bVar2 = Opnd::IsValueTypeFixed(&this->super_Opnd);
  if (bVar2) {
    Opnd::SetValueTypeFixed(&this_00->super_Opnd);
  }
  this_00->decodedValue = this->decodedValue;
  this_00->wasVar = (bool)(this->wasVar & 1);
  return this_00;
}

Assistant:

AddrOpnd *
AddrOpnd::CopyInternal(Func *func)
{
    Assert(m_kind == OpndKindAddr);
    AddrOpnd * newOpnd;

    newOpnd = AddrOpnd::New(nullptr, addrOpndKind, func, m_dontEncode);
    // Constructor evaluates address for type, but this is invalid if the address has been encoded, so we wait to set it
    newOpnd->m_address = m_address;
    newOpnd->m_valueType = m_valueType;
    newOpnd->m_isFunction = m_isFunction;
    newOpnd->m_metadata = m_metadata;
    newOpnd->SetType(m_type);
    if (IsValueTypeFixed())
    {
        newOpnd->SetValueTypeFixed();
    }

#if DBG_DUMP || defined(ENABLE_IR_VIEWER)
    newOpnd->decodedValue = this->decodedValue;
    newOpnd->wasVar = this->wasVar;
#endif

    return newOpnd;
}